

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-utils.h
# Opt level: O3

unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
* __thiscall
wasm::BranchUtils::BranchTargets::getBranches
          (unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
           *__return_storage_ptr__,BranchTargets *this,Name name)

{
  _Base_ptr p_Var1;
  const_iterator cVar2;
  undefined1 local_30 [8];
  Name name_local;
  __alloc_node_gen_t __alloc_node_gen;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  local_30 = name.super_IString.str._M_len;
  cVar2 = std::
          _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>_>_>
          ::find(&(this->inner).branches._M_t,(key_type *)local_30);
  if ((_Rb_tree_header *)cVar2._M_node == &(this->inner).branches._M_t._M_impl.super__Rb_tree_header
     ) {
    *(undefined8 *)&(__return_storage_ptr__->_M_h)._M_rehash_policy = 0;
    (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
    (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
    (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (__return_storage_ptr__->_M_h)._M_element_count = 0;
    (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
    (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
    (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  }
  else {
    (__return_storage_ptr__->_M_h)._M_buckets = (__buckets_ptr)0x0;
    (__return_storage_ptr__->_M_h)._M_bucket_count = (size_type)cVar2._M_node[1]._M_right;
    (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (__return_storage_ptr__->_M_h)._M_element_count = (size_type)cVar2._M_node[2]._M_parent;
    p_Var1 = cVar2._M_node[2]._M_right;
    *(_Base_ptr *)&(__return_storage_ptr__->_M_h)._M_rehash_policy = cVar2._M_node[2]._M_left;
    (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = (size_t)p_Var1;
    (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
    name_local.super_IString.str._M_str = (char *)__return_storage_ptr__;
    std::
    _Hashtable<wasm::Expression*,wasm::Expression*,std::allocator<wasm::Expression*>,std::__detail::_Identity,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_assign<std::_Hashtable<wasm::Expression*,wasm::Expression*,std::allocator<wasm::Expression*>,std::__detail::_Identity,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Expression*,false>>>>
              ((_Hashtable<wasm::Expression*,wasm::Expression*,std::allocator<wasm::Expression*>,std::__detail::_Identity,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)__return_storage_ptr__,
               (_Hashtable<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&cVar2._M_node[1]._M_left,
               (_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Expression_*,_false>_>_> *
               )&name_local.super_IString.str._M_str);
  }
  return __return_storage_ptr__;
}

Assistant:

std::unordered_set<Expression*> getBranches(Name name) const {
    auto iter = inner.branches.find(name);
    if (iter != inner.branches.end()) {
      return iter->second;
    }
    return {};
  }